

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::TraverseSchema::reportSchemaError
          (TraverseSchema *this,DOMElement *elem,XMLCh *msgDomain,int errorCode,XMLCh *text1,
          XMLCh *text2,XMLCh *text3,XMLCh *text4)

{
  XSDLocator *this_00;
  XMLCh *systemId;
  XMLFileLoc lineNo;
  XMLFileLoc columnNo;
  XMLCh *text2_local;
  XMLCh *text1_local;
  int errorCode_local;
  XMLCh *msgDomain_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  this_00 = this->fLocator;
  systemId = SchemaInfo::getCurrentSchemaURL(this->fSchemaInfo);
  lineNo = XSDElementNSImpl::getLineNo((XSDElementNSImpl *)elem);
  columnNo = XSDElementNSImpl::getColumnNo((XSDElementNSImpl *)elem);
  XSDLocator::setValues(this_00,systemId,(XMLCh *)0x0,lineNo,columnNo);
  XSDErrorReporter::emitError
            (&this->fXSDErrorReporter,errorCode,msgDomain,&this->fLocator->super_Locator,text1,text2
             ,text3,text4,this->fMemoryManager);
  return;
}

Assistant:

void TraverseSchema::reportSchemaError(const DOMElement* const elem,
                                       const XMLCh* const msgDomain,
                                       const int errorCode,
                                       const XMLCh* const text1,
                                       const XMLCh* const text2,
                                       const XMLCh* const text3,
                                       const XMLCh* const text4) {

    fLocator->setValues(fSchemaInfo->getCurrentSchemaURL(), 0,
                        ((XSDElementNSImpl*) elem)->getLineNo(),
                        ((XSDElementNSImpl*) elem)->getColumnNo());

    fXSDErrorReporter.emitError(errorCode, msgDomain, fLocator, text1, text2, text3, text4, fMemoryManager);
}